

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O0

void duckdb_zstd::ZSTD_DCtx_trace_end
               (ZSTD_DCtx *dctx,U64 uncompressedSize,U64 compressedSize,uint streaming)

{
  uint in_ECX;
  size_t in_RDX;
  size_t in_RSI;
  ZSTD_DCtx_s *in_RDI;
  ZSTD_Trace trace;
  ZSTD_Trace local_60;
  uint local_1c;
  size_t local_18;
  size_t local_10;
  ZSTD_DCtx_s *local_8;
  
  if (in_RDI->traceCtx != 0) {
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    memset(&local_60,0,0x40);
    local_60.version = 0x290a;
    local_60.streaming = local_1c;
    if (local_8->ddict != (ZSTD_DDict *)0x0) {
      local_60.dictionaryID = ZSTD_getDictID_fromDDict(local_8->ddict);
      local_60.dictionarySize = ZSTD_DDict_dictSize(local_8->ddict);
      local_60.dictionaryIsCold = local_8->ddictIsCold;
    }
    local_60.uncompressedSize = local_10;
    local_60.compressedSize = local_18;
    local_60.dctx = local_8;
    duckdb_zstd::ZSTD_trace_decompress_end(local_8->traceCtx,&local_60);
  }
  return;
}

Assistant:

static void ZSTD_DCtx_trace_end(ZSTD_DCtx const* dctx, U64 uncompressedSize, U64 compressedSize, unsigned streaming)
{
#if ZSTD_TRACE
    if (dctx->traceCtx && ZSTD_trace_decompress_end != NULL) {
        ZSTD_Trace trace;
        ZSTD_memset(&trace, 0, sizeof(trace));
        trace.version = ZSTD_VERSION_NUMBER;
        trace.streaming = streaming;
        if (dctx->ddict) {
            trace.dictionaryID = ZSTD_getDictID_fromDDict(dctx->ddict);
            trace.dictionarySize = ZSTD_DDict_dictSize(dctx->ddict);
            trace.dictionaryIsCold = dctx->ddictIsCold;
        }
        trace.uncompressedSize = (size_t)uncompressedSize;
        trace.compressedSize = (size_t)compressedSize;
        trace.dctx = dctx;
        ZSTD_trace_decompress_end(dctx->traceCtx, &trace);
    }
#else
    (void)dctx;
    (void)uncompressedSize;
    (void)compressedSize;
    (void)streaming;
#endif
}